

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
PossibleContentsTest_TestIntersection_Test::TestBody
          (PossibleContentsTest_TestIntersection_Test *this)

{
  PossibleContents *pPVar1;
  PossibleContents local_560;
  PossibleContents local_540;
  PossibleContents local_520;
  PossibleContents local_500;
  PossibleContents local_4e0;
  PossibleContents local_4c0;
  PossibleContents local_4a0;
  PossibleContents local_480;
  PossibleContents local_460;
  PossibleContents local_440;
  PossibleContents local_420;
  PossibleContents local_400;
  PossibleContents local_3e0;
  PossibleContents local_3c0;
  PossibleContents local_3a0;
  PossibleContents local_380;
  PossibleContents local_360;
  PossibleContents local_340;
  PossibleContents local_320;
  PossibleContents local_300;
  PossibleContents local_2e0;
  PossibleContents local_2c0;
  PossibleContents local_2a0;
  PossibleContents local_280;
  PossibleContents local_260;
  PossibleContents local_240;
  PossibleContents local_220;
  PossibleContents local_200;
  PossibleContents local_1e0;
  PossibleContents local_1c0;
  PossibleContents local_1a0;
  PossibleContents local_180;
  PossibleContents local_160;
  PossibleContents local_140;
  PossibleContents local_120;
  PossibleContents local_100;
  PossibleContents local_e0;
  PossibleContents local_c0;
  PossibleContents local_a0;
  PossibleContents local_80;
  PossibleContents local_50;
  PossibleContents local_30;
  PossibleContentsTest_TestIntersection_Test *local_10;
  PossibleContentsTest_TestIntersection_Test *this_local;
  
  pPVar1 = &(this->super_PossibleContentsTest).none;
  local_10 = this;
  wasm::PossibleContents::PossibleContents(&local_30,pPVar1);
  wasm::PossibleContents::PossibleContents(&local_50,pPVar1);
  assertLackIntersection(&local_30,&local_50);
  wasm::PossibleContents::~PossibleContents(&local_50);
  wasm::PossibleContents::~PossibleContents(&local_30);
  wasm::PossibleContents::PossibleContents(&local_80,&(this->super_PossibleContentsTest).none);
  wasm::PossibleContents::PossibleContents(&local_a0,&(this->super_PossibleContentsTest).i32Zero);
  assertLackIntersection(&local_80,&local_a0);
  wasm::PossibleContents::~PossibleContents(&local_a0);
  wasm::PossibleContents::~PossibleContents(&local_80);
  wasm::PossibleContents::PossibleContents(&local_c0,&(this->super_PossibleContentsTest).none);
  wasm::PossibleContents::PossibleContents(&local_e0,&(this->super_PossibleContentsTest).many);
  assertLackIntersection(&local_c0,&local_e0);
  wasm::PossibleContents::~PossibleContents(&local_e0);
  wasm::PossibleContents::~PossibleContents(&local_c0);
  pPVar1 = &(this->super_PossibleContentsTest).many;
  wasm::PossibleContents::PossibleContents(&local_100,pPVar1);
  wasm::PossibleContents::PossibleContents(&local_120,pPVar1);
  assertHaveIntersection(&local_100,&local_120);
  wasm::PossibleContents::~PossibleContents(&local_120);
  wasm::PossibleContents::~PossibleContents(&local_100);
  wasm::PossibleContents::PossibleContents(&local_140,&(this->super_PossibleContentsTest).many);
  wasm::PossibleContents::PossibleContents(&local_160,&(this->super_PossibleContentsTest).i32Zero);
  assertHaveIntersection(&local_140,&local_160);
  wasm::PossibleContents::~PossibleContents(&local_160);
  wasm::PossibleContents::~PossibleContents(&local_140);
  wasm::PossibleContents::PossibleContents(&local_180,&(this->super_PossibleContentsTest).exactI32);
  wasm::PossibleContents::PossibleContents
            (&local_1a0,&(this->super_PossibleContentsTest).exactAnyref);
  assertLackIntersection(&local_180,&local_1a0);
  wasm::PossibleContents::~PossibleContents(&local_1a0);
  wasm::PossibleContents::~PossibleContents(&local_180);
  wasm::PossibleContents::PossibleContents(&local_1c0,&(this->super_PossibleContentsTest).i32Zero);
  wasm::PossibleContents::PossibleContents
            (&local_1e0,&(this->super_PossibleContentsTest).exactAnyref);
  assertLackIntersection(&local_1c0,&local_1e0);
  wasm::PossibleContents::~PossibleContents(&local_1e0);
  wasm::PossibleContents::~PossibleContents(&local_1c0);
  wasm::PossibleContents::PossibleContents
            (&local_200,&(this->super_PossibleContentsTest).exactFuncSignatureType);
  wasm::PossibleContents::PossibleContents(&local_220,&(this->super_PossibleContentsTest).funcNull);
  assertHaveIntersection(&local_200,&local_220);
  wasm::PossibleContents::~PossibleContents(&local_220);
  wasm::PossibleContents::~PossibleContents(&local_200);
  wasm::PossibleContents::PossibleContents
            (&local_240,&(this->super_PossibleContentsTest).exactFuncSignatureType);
  wasm::PossibleContents::PossibleContents
            (&local_260,&(this->super_PossibleContentsTest).exactAnyref);
  assertLackIntersection(&local_240,&local_260);
  wasm::PossibleContents::~PossibleContents(&local_260);
  wasm::PossibleContents::~PossibleContents(&local_240);
  wasm::PossibleContents::PossibleContents(&local_280,&(this->super_PossibleContentsTest).anyNull);
  wasm::PossibleContents::PossibleContents(&local_2a0,&(this->super_PossibleContentsTest).funcNull);
  assertLackIntersection(&local_280,&local_2a0);
  wasm::PossibleContents::~PossibleContents(&local_2a0);
  wasm::PossibleContents::~PossibleContents(&local_280);
  pPVar1 = &(this->super_PossibleContentsTest).exactI32;
  wasm::PossibleContents::PossibleContents(&local_2c0,pPVar1);
  wasm::PossibleContents::PossibleContents(&local_2e0,pPVar1);
  assertHaveIntersection(&local_2c0,&local_2e0);
  wasm::PossibleContents::~PossibleContents(&local_2e0);
  wasm::PossibleContents::~PossibleContents(&local_2c0);
  pPVar1 = &(this->super_PossibleContentsTest).i32Zero;
  wasm::PossibleContents::PossibleContents(&local_300,pPVar1);
  wasm::PossibleContents::PossibleContents(&local_320,pPVar1);
  assertHaveIntersection(&local_300,&local_320);
  wasm::PossibleContents::~PossibleContents(&local_320);
  wasm::PossibleContents::~PossibleContents(&local_300);
  pPVar1 = &(this->super_PossibleContentsTest).exactFuncSignatureType;
  wasm::PossibleContents::PossibleContents(&local_340,pPVar1);
  wasm::PossibleContents::PossibleContents(&local_360,pPVar1);
  assertHaveIntersection(&local_340,&local_360);
  wasm::PossibleContents::~PossibleContents(&local_360);
  wasm::PossibleContents::~PossibleContents(&local_340);
  wasm::PossibleContents::PossibleContents(&local_380,&(this->super_PossibleContentsTest).i32Zero);
  wasm::PossibleContents::PossibleContents(&local_3a0,&(this->super_PossibleContentsTest).i32One);
  assertHaveIntersection(&local_380,&local_3a0);
  wasm::PossibleContents::~PossibleContents(&local_3a0);
  wasm::PossibleContents::~PossibleContents(&local_380);
  wasm::PossibleContents::PossibleContents
            (&local_3c0,&(this->super_PossibleContentsTest).exactAnyref);
  wasm::PossibleContents::PossibleContents
            (&local_3e0,&(this->super_PossibleContentsTest).exactNonNullAnyref);
  assertHaveIntersection(&local_3c0,&local_3e0);
  wasm::PossibleContents::~PossibleContents(&local_3e0);
  wasm::PossibleContents::~PossibleContents(&local_3c0);
  pPVar1 = &(this->super_PossibleContentsTest).funcGlobal;
  wasm::PossibleContents::PossibleContents(&local_400,pPVar1);
  wasm::PossibleContents::PossibleContents(&local_420,pPVar1);
  assertHaveIntersection(&local_400,&local_420);
  wasm::PossibleContents::~PossibleContents(&local_420);
  wasm::PossibleContents::~PossibleContents(&local_400);
  wasm::PossibleContents::PossibleContents
            (&local_440,&(this->super_PossibleContentsTest).funcGlobal);
  wasm::PossibleContents::PossibleContents
            (&local_460,&(this->super_PossibleContentsTest).exactFuncSignatureType);
  assertHaveIntersection(&local_440,&local_460);
  wasm::PossibleContents::~PossibleContents(&local_460);
  wasm::PossibleContents::~PossibleContents(&local_440);
  wasm::PossibleContents::PossibleContents
            (&local_480,&(this->super_PossibleContentsTest).nonNullFuncGlobal);
  wasm::PossibleContents::PossibleContents
            (&local_4a0,&(this->super_PossibleContentsTest).exactFuncSignatureType);
  assertHaveIntersection(&local_480,&local_4a0);
  wasm::PossibleContents::~PossibleContents(&local_4a0);
  wasm::PossibleContents::~PossibleContents(&local_480);
  wasm::PossibleContents::PossibleContents
            (&local_4c0,&(this->super_PossibleContentsTest).funcGlobal);
  wasm::PossibleContents::PossibleContents
            (&local_4e0,&(this->super_PossibleContentsTest).exactNonNullFuncSignatureType);
  assertHaveIntersection(&local_4c0,&local_4e0);
  wasm::PossibleContents::~PossibleContents(&local_4e0);
  wasm::PossibleContents::~PossibleContents(&local_4c0);
  wasm::PossibleContents::PossibleContents
            (&local_500,&(this->super_PossibleContentsTest).nonNullFuncGlobal);
  wasm::PossibleContents::PossibleContents
            (&local_520,&(this->super_PossibleContentsTest).exactNonNullFuncSignatureType);
  assertHaveIntersection(&local_500,&local_520);
  wasm::PossibleContents::~PossibleContents(&local_520);
  wasm::PossibleContents::~PossibleContents(&local_500);
  wasm::PossibleContents::PossibleContents
            (&local_540,&(this->super_PossibleContentsTest).funcGlobal);
  wasm::PossibleContents::PossibleContents(&local_560,&(this->super_PossibleContentsTest).anyGlobal)
  ;
  assertLackIntersection(&local_540,&local_560);
  wasm::PossibleContents::~PossibleContents(&local_560);
  wasm::PossibleContents::~PossibleContents(&local_540);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestIntersection) {
  // None has no contents, so nothing to intersect.
  assertLackIntersection(none, none);
  assertLackIntersection(none, i32Zero);
  assertLackIntersection(none, many);

  // Many intersects with anything (but none).
  assertHaveIntersection(many, many);
  assertHaveIntersection(many, i32Zero);

  // Different exact types cannot intersect.
  assertLackIntersection(exactI32, exactAnyref);
  assertLackIntersection(i32Zero, exactAnyref);

  // But nullable ones can - the null can be the intersection, if they are not
  // in separate hierarchies.
  assertHaveIntersection(exactFuncSignatureType, funcNull);

  assertLackIntersection(exactFuncSignatureType, exactAnyref);
  assertLackIntersection(anyNull, funcNull);

  // Identical types might.
  assertHaveIntersection(exactI32, exactI32);
  assertHaveIntersection(i32Zero, i32Zero);
  assertHaveIntersection(exactFuncSignatureType, exactFuncSignatureType);
  assertHaveIntersection(i32Zero, i32One); // TODO: this could be inferred false

  // Exact types only differing by nullability can intersect (not on the null,
  // but on something else).
  assertHaveIntersection(exactAnyref, exactNonNullAnyref);

  // Due to subtyping, an intersection might exist.
  assertHaveIntersection(funcGlobal, funcGlobal);
  assertHaveIntersection(funcGlobal, exactFuncSignatureType);
  assertHaveIntersection(nonNullFuncGlobal, exactFuncSignatureType);
  assertHaveIntersection(funcGlobal, exactNonNullFuncSignatureType);
  assertHaveIntersection(nonNullFuncGlobal, exactNonNullFuncSignatureType);

  // Separate hierarchies.
  assertLackIntersection(funcGlobal, anyGlobal);
}